

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O3

void Am_Move_Cursor_Right(Am_Object *text)

{
  Am_Code_Flag AVar1;
  Am_Object *this;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  
  Am_Object::Am_Object(&local_20,text);
  AVar1 = ml_which_code(&local_20);
  Am_Object::~Am_Object(&local_20);
  if (AVar1 == Am_ONE_BYTE_CODE) {
    this = &local_28;
    Am_Object::Am_Object(this,text);
    Am_Move_Cursor_Right(this,1);
  }
  else {
    this = &local_30;
    Am_Object::Am_Object(this,text);
    Am_Move_Cursor_Right(this,2);
  }
  Am_Object::~Am_Object(this);
  return;
}

Assistant:

void
Am_Move_Cursor_Right(Am_Object text)
{
  switch (ml_which_code(text)) {
  case Am_ONE_BYTE_CODE:
    Am_Move_Cursor_Right(text, 1);
    break;
  case Am_TWO_BYTE_CODE:
    Am_Move_Cursor_Right(text, 2);
    break;
  case Am_SHIFT_JIS_CODE: {
    int pos = text.Get(Am_CURSOR_INDEX);
    Am_String p = text.Get(Am_TEXT);

    if (ml_two_byte_SHIFT_JIS(&(((const char *)p)[pos]), (const char *)p))
      Am_Move_Cursor_Right(text, 2);
    else
      Am_Move_Cursor_Right(text, 1);
    break;
  }
  }
}